

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_tattle(REF_INTERP ref_interp,REF_INT node)

{
  int iVar1;
  REF_MPI pRVar2;
  REF_DBL *pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  REF_DBL xyz [3];
  REF_INT nodes [27];
  double local_d8 [4];
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  if (node < ref_interp->max) {
    if (ref_interp->cell[node] == 0xffffffff) {
      uVar5 = 0;
      printf("empty cell %d\n",(ulong)(uint)node);
    }
    else {
      pRVar2 = ref_interp->ref_mpi;
      uVar5 = 0;
      printf("cell %d part %d node %d\n",(ulong)(uint)ref_interp->cell[node],
             (ulong)(uint)ref_interp->part[node],(ulong)(uint)node);
      pRVar3 = ref_interp->bary;
      printf("bary %f %f %f %f\n",pRVar3[node * 4],pRVar3[node * 4 + 1],pRVar3[node * 4 + 2],
             pRVar3[node * 4 + 3]);
      pRVar3 = ref_interp->to_grid->node->real;
      lVar8 = (long)(node * 0xf);
      printf("target %f %f %f\n",pRVar3[lVar8],pRVar3[lVar8 + 1],pRVar3[lVar8 + 2]);
      if (pRVar2->id == ref_interp->part[node]) {
        uVar5 = ref_cell_nodes(ref_interp->from_tet,ref_interp->cell[node],local_a8);
        if (uVar5 == 0) {
          local_d8[0] = 0.0;
          local_d8[1] = 0.0;
          local_d8[2] = 0.0;
          pRVar3 = ref_interp->bary;
          pRVar4 = ref_interp->from_grid->node->real;
          uVar6 = 0;
          do {
            dVar9 = pRVar3[uVar6 | (long)(node * 4)];
            iVar1 = local_a8[uVar6];
            lVar7 = 0;
            do {
              local_d8[lVar7] = pRVar4[(long)iVar1 * 0xf + lVar7] * dVar9 + local_d8[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            uVar6 = uVar6 + 1;
          } while (uVar6 != 4);
          pRVar3 = ref_interp->to_grid->node->real;
          dVar9 = (local_d8[2] - pRVar3[lVar8 + 2]) * (local_d8[2] - pRVar3[lVar8 + 2]) +
                  (local_d8[1] - pRVar3[lVar8 + 1]) * (local_d8[1] - pRVar3[lVar8 + 1]) +
                  (local_d8[0] - pRVar3[lVar8]) * (local_d8[0] - pRVar3[lVar8]);
          if (dVar9 < 0.0) {
            local_b0 = local_d8[0];
            local_b8 = local_d8[1];
            local_d8[3] = local_d8[2];
            dVar9 = sqrt(dVar9);
            dVar10 = local_b8;
            dVar11 = local_d8[3];
            dVar12 = local_b0;
          }
          else {
            dVar9 = SQRT(dVar9);
            dVar10 = local_d8[1];
            dVar11 = local_d8[2];
            dVar12 = local_d8[0];
          }
          printf("interp %f %f %f error %e\n",dVar12,dVar10,dVar11,dVar9);
          uVar5 = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x26d,"ref_interp_tattle",(ulong)uVar5,"node needs to be localized");
        }
      }
    }
  }
  else {
    uVar5 = 0;
    printf("max %d too small for %d\n",(ulong)(uint)ref_interp->max,(ulong)(uint)node);
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_interp_tattle(REF_INTERP ref_interp, REF_INT node) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_INT i, j, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz[3], error;
  if (NULL == ref_interp) {
    printf("NULL interp %d\n", node);
    return REF_SUCCESS;
  }
  if (node >= ref_interp_max(ref_interp)) {
    printf("max %d too small for %d\n", ref_interp_max(ref_interp), node);
    return REF_SUCCESS;
  }
  if (REF_EMPTY == ref_interp->cell[node]) {
    printf("empty cell %d\n", node);
    return REF_SUCCESS;
  }
  printf("cell %d part %d node %d\n", ref_interp->cell[node],
         ref_interp->part[node], node);
  printf("bary %f %f %f %f\n", ref_interp->bary[0 + 4 * node],
         ref_interp->bary[1 + 4 * node], ref_interp->bary[2 + 4 * node],
         ref_interp->bary[3 + 4 * node]);
  printf("target %f %f %f\n",
         ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)), 0, node),
         ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)), 1, node),
         ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)), 2, node));
  if (ref_mpi_rank(ref_mpi) == ref_interp->part[node]) {
    RSS(ref_cell_nodes(ref_interp_from_tet(ref_interp), ref_interp->cell[node],
                       nodes),
        "node needs to be localized");

    for (i = 0; i < 3; i++) xyz[i] = 0.0;
    for (j = 0; j < 4; j++) {
      for (i = 0; i < 3; i++) {
        xyz[i] += ref_interp->bary[j + 4 * node] *
                  ref_node_xyz(ref_grid_node(ref_interp_from_grid(ref_interp)),
                               i, nodes[j]);
      }
    }

    error =
        pow(xyz[0] - ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)),
                                  0, node),
            2) +
        pow(xyz[1] - ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)),
                                  1, node),
            2) +
        pow(xyz[2] - ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)),
                                  2, node),
            2);
    error = sqrt(error);
    printf("interp %f %f %f error %e\n", xyz[0], xyz[1], xyz[2], error);
  }

  return REF_SUCCESS;
}